

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collimator.cpp
# Opt level: O0

void __thiscall imrt::Collimator::printCoordinates(Collimator *this)

{
  bool bVar1;
  _Rb_tree_iterator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>
  *this_00;
  pointer ppVar2;
  _Rb_tree_iterator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_> *p_Var3
  ;
  ostream *poVar4;
  reference pvVar5;
  void *this_01;
  int i;
  iterator it;
  map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
  *in_stack_ffffffffffffffb8;
  ostream *in_stack_ffffffffffffffc0;
  int local_1c;
  _Self local_18;
  _Self local_10 [2];
  
  local_10[0]._M_node =
       (_Base_ptr)
       std::
       map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
       ::begin(in_stack_ffffffffffffffb8);
  while( true ) {
    local_18._M_node =
         (_Base_ptr)
         std::
         map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
         ::end(in_stack_ffffffffffffffb8);
    bVar1 = std::operator!=(local_10,&local_18);
    if (!bVar1) break;
    local_1c = 0;
    while( true ) {
      this_00 = (_Rb_tree_iterator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>
                 *)(long)local_1c;
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>
                             *)0x148b20);
      p_Var3 = (_Rb_tree_iterator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>
                *)std::vector<double,_std::allocator<double>_>::size(&ppVar2->second);
      if (p_Var3 <= this_00) break;
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>
                             *)0x148b43);
      poVar4 = (ostream *)std::ostream::operator<<(&std::cout,ppVar2->first);
      in_stack_ffffffffffffffc0 = std::operator<<(poVar4," : ");
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>
                             *)0x148b71);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&ppVar2->second,(long)local_1c);
      this_01 = (void *)std::ostream::operator<<(in_stack_ffffffffffffffc0,*pvVar5);
      std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
      local_1c = local_1c + 1;
    }
    std::_Rb_tree_iterator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>
    ::operator++(this_00,(int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
  }
  return;
}

Assistant:

void Collimator::printCoordinates() {
    for (map<double, vector<double> >::iterator it = beam_coord.begin() ; it != beam_coord.end() ; it ++ ) {
      for (int i=0; i < it->second.size(); i++) {
        cout << it->first << " : " << it->second[i] << endl;
      }
    }
  }